

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiDeviceInitializationTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::createDeviceWithVariousQueueCountsTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  allocator<float> *this;
  uint uVar1;
  VkInstance instance_00;
  RefData<vk::VkInstance_s_*> data;
  RefData<vk::VkDevice_s_*> data_00;
  VkAllocationCallbacks *platformInterface_00;
  deUint32 dVar2;
  deBool dVar3;
  TestContext *pTVar4;
  TestLog *this_00;
  VkInstance_s **ppVVar5;
  CommandLine *cmdLine;
  VkPhysicalDevice physicalDevice_00;
  size_type sVar6;
  const_reference pvVar7;
  VkDeviceQueueCreateInfo *pVVar8;
  reference value;
  VkDevice_s **ppVVar9;
  TestError *this_01;
  MessageBuilder *pMVar10;
  allocator<char> local_9e1;
  string local_9e0;
  int local_9c0;
  allocator<char> local_9b9;
  string local_9b8;
  MessageBuilder local_998;
  VkResult local_814;
  VkQueue pVStack_810;
  VkResult result;
  VkQueue queue;
  uint local_800;
  deUint32 queueIndex;
  deUint32 queueCount_1;
  deUint32 queueFamilyIndex;
  DeviceDriver deviceDriver;
  RefData<vk::VkDevice_s_*> local_328;
  undefined1 local_310 [8];
  Unique<vk::VkDevice_s_*> device;
  VkDeviceCreateInfo deviceCreateInfo;
  VkDeviceQueueCreateInfo *queueCreateInfo_1;
  size_t testNdx;
  VkDeviceQueueCreateInfo queueCreateInfo;
  deUint32 queueCount;
  deUint32 maxQueueCount;
  deUint32 queueFamilyNdx;
  vector<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>
  deviceQueueCreateInfos;
  undefined1 local_248 [8];
  vector<float,_std::allocator<float>_> queuePriorities;
  vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
  queueFamilyProperties;
  VkPhysicalDevice physicalDevice;
  InstanceDriver instanceDriver;
  Move<vk::VkInstance_s_*> local_78;
  RefData<vk::VkInstance_s_*> local_60;
  undefined1 local_48 [8];
  Unique<vk::VkInstance_s_*> instance;
  PlatformInterface *platformInterface;
  int queueCountDiff;
  TestLog *log;
  Context *context_local;
  
  pTVar4 = Context::getTestContext(context);
  this_00 = tcu::TestContext::getLog(pTVar4);
  instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)Context::getPlatformInterface(context);
  ::vk::createDefaultInstance
            (&local_78,
             (PlatformInterface *)
             instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_60,(Move *)&local_78);
  data.deleter.m_destroyInstance = local_60.deleter.m_destroyInstance;
  data.object = local_60.object;
  data.deleter.m_allocator = local_60.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::VkInstance_s_*>::Unique((Unique<vk::VkInstance_s_*> *)local_48,data);
  ::vk::refdetails::Move<vk::VkInstance_s_*>::~Move(&local_78);
  platformInterface_00 = instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator;
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::get
                      ((RefBase<vk::VkInstance_s_*> *)local_48);
  ::vk::InstanceDriver::InstanceDriver
            ((InstanceDriver *)&physicalDevice,(PlatformInterface *)platformInterface_00,*ppVVar5);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::get
                      ((RefBase<vk::VkInstance_s_*> *)local_48);
  instance_00 = *ppVVar5;
  pTVar4 = Context::getTestContext(context);
  cmdLine = tcu::TestContext::getCommandLine(pTVar4);
  physicalDevice_00 = ::vk::chooseDevice((InstanceInterface *)&physicalDevice,instance_00,cmdLine);
  ::vk::getPhysicalDeviceQueueFamilyProperties
            ((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> *)
             &queuePriorities.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(InstanceInterface *)&physicalDevice,
             physicalDevice_00);
  dVar2 = getGlobalMaxQueueCount
                    ((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                      *)&queuePriorities.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  deviceQueueCreateInfos.
  super__Vector_base<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x3f800000;
  this = (allocator<float> *)
         ((long)&deviceQueueCreateInfos.
                 super__Vector_base<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<float>::allocator(this);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_248,(ulong)dVar2,
             (value_type_conflict3 *)
             ((long)&deviceQueueCreateInfos.
                     super__Vector_base<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),this);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&deviceQueueCreateInfos.
                     super__Vector_base<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::vector<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>::vector
            ((vector<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_> *)
             &maxQueueCount);
  queueCount = 0;
  while( true ) {
    sVar6 = std::vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::
            size((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                  *)&queuePriorities.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
    if ((uint)sVar6 <= queueCount) break;
    pvVar7 = std::vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
             ::operator[]((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                           *)&queuePriorities.super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)queueCount);
    uVar1 = pvVar7->queueCount;
    for (queueCreateInfo.pQueuePriorities._4_4_ = 1; queueCreateInfo.pQueuePriorities._4_4_ <= uVar1
        ; queueCreateInfo.pQueuePriorities._4_4_ = queueCreateInfo.pQueuePriorities._4_4_ + 1) {
      testNdx._0_4_ = 2;
      queueCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      queueCreateInfo._4_4_ = 0;
      queueCreateInfo.pNext._0_4_ = 0;
      queueCreateInfo.pNext._4_4_ = queueCount;
      queueCreateInfo.flags = queueCreateInfo.pQueuePriorities._4_4_;
      queueCreateInfo._24_8_ =
           std::vector<float,_std::allocator<float>_>::data
                     ((vector<float,_std::allocator<float>_> *)local_248);
      std::vector<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>::
      push_back((vector<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_> *
                )&maxQueueCount,(value_type *)&testNdx);
    }
    queueCount = queueCount + 1;
  }
  queueCreateInfo_1 = (VkDeviceQueueCreateInfo *)0x0;
  while( true ) {
    pVVar8 = (VkDeviceQueueCreateInfo *)
             std::vector<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>
             ::size((vector<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>
                     *)&maxQueueCount);
    if (pVVar8 <= queueCreateInfo_1) break;
    value = std::vector<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>::
            operator[]((vector<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>
                        *)&maxQueueCount,(size_type)queueCreateInfo_1);
    device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x3
    ;
    ::vk::createDevice((Move<vk::VkDevice_s_*> *)&deviceDriver.m_vk.getPastPresentationTimingGOOGLE,
                       (InstanceInterface *)&physicalDevice,physicalDevice_00,
                       (VkDeviceCreateInfo *)
                       &device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator,
                       (VkAllocationCallbacks *)0x0);
    ::vk::refdetails::Move::operator_cast_to_RefData
              (&local_328,(Move *)&deviceDriver.m_vk.getPastPresentationTimingGOOGLE);
    data_00.deleter.m_destroyDevice = local_328.deleter.m_destroyDevice;
    data_00.object = local_328.object;
    data_00.deleter.m_allocator = local_328.deleter.m_allocator;
    ::vk::refdetails::Unique<vk::VkDevice_s_*>::Unique
              ((Unique<vk::VkDevice_s_*> *)local_310,data_00);
    ::vk::refdetails::Move<vk::VkDevice_s_*>::~Move
              ((Move<vk::VkDevice_s_*> *)&deviceDriver.m_vk.getPastPresentationTimingGOOGLE);
    ppVVar9 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::get
                        ((RefBase<vk::VkDevice_s_*> *)local_310);
    ::vk::DeviceDriver::DeviceDriver
              ((DeviceDriver *)&queueCount_1,(InstanceInterface *)&physicalDevice,*ppVVar9);
    queueIndex = value->queueFamilyIndex;
    local_800 = value->queueCount;
    for (queue._4_4_ = 0; queue._4_4_ < local_800; queue._4_4_ = queue._4_4_ + 1) {
      ppVVar9 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                          ((RefBase<vk::VkDevice_s_*> *)local_310);
      pVStack_810 = ::vk::getDeviceQueue
                              ((DeviceInterface *)&queueCount_1,*ppVVar9,queueIndex,queue._4_4_);
      do {
        dVar3 = ::deGetFalse();
        if ((dVar3 != 0) || (pVStack_810 == (VkQueue)0x0)) {
          this_01 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_01,(char *)0x0,"!!queue",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiDeviceInitializationTests.cpp"
                     ,0x264);
          __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        dVar3 = ::deGetFalse();
      } while (dVar3 != 0);
      local_814 = ::vk::DeviceDriver::queueWaitIdle((DeviceDriver *)&queueCount_1,pVStack_810);
      if (local_814 != VK_SUCCESS) {
        tcu::TestLog::operator<<(&local_998,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar10 = tcu::MessageBuilder::operator<<
                            (&local_998,(char (*) [23])"vkQueueWaitIdle failed");
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [17])",  queueIndex = ");
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(uint *)((long)&queue + 4));
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [19])", queueCreateInfo ");
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,value);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [15])", Error Code: ");
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_814);
        tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_998);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_9b8,"Fail",&local_9b9);
        tcu::TestStatus::fail(__return_storage_ptr__,&local_9b8);
        std::__cxx11::string::~string((string *)&local_9b8);
        std::allocator<char>::~allocator(&local_9b9);
        local_9c0 = 1;
        goto LAB_007bbcea;
      }
    }
    local_9c0 = 0;
LAB_007bbcea:
    ::vk::DeviceDriver::~DeviceDriver((DeviceDriver *)&queueCount_1);
    ::vk::refdetails::Unique<vk::VkDevice_s_*>::~Unique((Unique<vk::VkDevice_s_*> *)local_310);
    if (local_9c0 != 0) goto LAB_007bbde4;
    queueCreateInfo_1 = (VkDeviceQueueCreateInfo *)((long)&queueCreateInfo_1->sType + 1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9e0,"Pass",&local_9e1);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_9e0);
  std::__cxx11::string::~string((string *)&local_9e0);
  std::allocator<char>::~allocator(&local_9e1);
  local_9c0 = 1;
LAB_007bbde4:
  std::vector<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>::~vector
            ((vector<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_> *)
             &maxQueueCount);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_248);
  std::vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::~vector
            ((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> *)
             &queuePriorities.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ::vk::InstanceDriver::~InstanceDriver((InstanceDriver *)&physicalDevice);
  ::vk::refdetails::Unique<vk::VkInstance_s_*>::~Unique((Unique<vk::VkInstance_s_*> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createDeviceWithVariousQueueCountsTest (Context& context)
{
	tcu::TestLog&							log						= context.getTestContext().getLog();
	const int								queueCountDiff			= 1;
	const PlatformInterface&				platformInterface		= context.getPlatformInterface();
	const Unique<VkInstance>				instance				(createDefaultInstance(platformInterface));
	const InstanceDriver					instanceDriver			(platformInterface, instance.get());
	const VkPhysicalDevice					physicalDevice			= chooseDevice(instanceDriver, instance.get(), context.getTestContext().getCommandLine());
	const vector<VkQueueFamilyProperties>	queueFamilyProperties	= getPhysicalDeviceQueueFamilyProperties(instanceDriver, physicalDevice);
	const vector<float>						queuePriorities			(getGlobalMaxQueueCount(queueFamilyProperties), 1.0f);
	vector<VkDeviceQueueCreateInfo>			deviceQueueCreateInfos;

	for (deUint32 queueFamilyNdx = 0; queueFamilyNdx < (deUint32)queueFamilyProperties.size(); queueFamilyNdx++)
	{
		const deUint32 maxQueueCount = queueFamilyProperties[queueFamilyNdx].queueCount;

		for (deUint32 queueCount = 1; queueCount <= maxQueueCount; queueCount += queueCountDiff)
		{
			const VkDeviceQueueCreateInfo queueCreateInfo =
			{
				VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO,
				DE_NULL,
				(VkDeviceQueueCreateFlags)0u,
				queueFamilyNdx,
				queueCount,
				queuePriorities.data()
			};

			deviceQueueCreateInfos.push_back(queueCreateInfo);
		}
	}

	for (size_t testNdx = 0; testNdx < deviceQueueCreateInfos.size(); testNdx++)
	{
		const VkDeviceQueueCreateInfo&	queueCreateInfo		= deviceQueueCreateInfos[testNdx];
		const VkDeviceCreateInfo		deviceCreateInfo	=
		{
			VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO,	//sType;
			DE_NULL,								//pNext;
			(VkDeviceCreateFlags)0u,
			1,										//queueRecordCount;
			&queueCreateInfo,						//pRequestedQueues;
			0,										//layerCount;
			DE_NULL,								//ppEnabledLayerNames;
			0,										//extensionCount;
			DE_NULL,								//ppEnabledExtensionNames;
			DE_NULL,								//pEnabledFeatures;
		};
		const Unique<VkDevice>			device				(createDevice(instanceDriver, physicalDevice, &deviceCreateInfo));
		const DeviceDriver				deviceDriver		(instanceDriver, device.get());
		const deUint32					queueFamilyIndex	= deviceCreateInfo.pQueueCreateInfos->queueFamilyIndex;
		const deUint32					queueCount			= deviceCreateInfo.pQueueCreateInfos->queueCount;

		for (deUint32 queueIndex = 0; queueIndex < queueCount; queueIndex++)
		{
			const VkQueue		queue	= getDeviceQueue(deviceDriver, *device, queueFamilyIndex, queueIndex);
			VkResult			result;

			TCU_CHECK(!!queue);

			result = deviceDriver.queueWaitIdle(queue);
			if (result != VK_SUCCESS)
			{
				log << TestLog::Message
					<< "vkQueueWaitIdle failed"
					<< ",  queueIndex = " << queueIndex
					<< ", queueCreateInfo " << queueCreateInfo
					<< ", Error Code: " << result
					<< TestLog::EndMessage;
				return tcu::TestStatus::fail("Fail");
			}
		}
	}
	return tcu::TestStatus::pass("Pass");
}